

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutex-posix.c
# Opt level: O3

pboolean p_mutex_unlock(PMutex *mutex)

{
  int iVar1;
  pboolean pVar2;
  
  if (mutex == (PMutex *)0x0) {
    pVar2 = 0;
  }
  else {
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)mutex);
    if (iVar1 == 0) {
      pVar2 = 1;
    }
    else {
      pVar2 = 0;
      printf("** Error: %s **\n","PMutex::p_mutex_unlock: pthread_mutex_unlock() failed");
    }
  }
  return pVar2;
}

Assistant:

P_LIB_API pboolean
p_mutex_unlock (PMutex *mutex)
{
	if (P_UNLIKELY (mutex == NULL))
		return FALSE;

	if (P_LIKELY (pthread_mutex_unlock (&mutex->hdl) == 0))
		return TRUE;
	else {
		P_ERROR ("PMutex::p_mutex_unlock: pthread_mutex_unlock() failed");
		return FALSE;
	}
}